

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

int test_loop(char *rom_filename,int num_log_lines,char *log_filename,uint32_t test_failed_address,
             int watch_reg)

{
  uint32_t uVar1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  undefined8 auStackY_a00 [2];
  char *in_stack_fffffffffffff618;
  char *in_stack_fffffffffffff620;
  undefined8 local_980;
  uint32_t local_974;
  ulong local_970 [2];
  FILE *local_960;
  uint local_954;
  ulong local_948;
  uint32_t local_93c;
  FILE *local_928;
  uint local_91c;
  uint32_t local_904;
  arm7tdmi_t *in_stack_fffffffffffff700;
  FILE *local_848;
  uint local_83c;
  uint32_t local_824;
  FILE *local_810;
  uint local_804;
  uint32_t local_7ec;
  FILE *local_7d8;
  uint local_7cc;
  uint32_t local_7b4;
  FILE *local_7a0;
  uint local_794;
  uint32_t local_77c;
  FILE *local_768;
  uint local_75c;
  uint32_t local_744;
  FILE *local_730;
  uint local_724;
  uint32_t local_70c;
  FILE *local_6f8;
  uint local_6ec;
  uint32_t local_6d4;
  FILE *local_6c0;
  uint local_6b4;
  uint32_t local_69c;
  FILE *local_688;
  uint local_67c;
  uint32_t local_664;
  undefined1 *local_660;
  uint local_654;
  uint32_t failed_test;
  int local_648;
  uint32_t adjusted_pc;
  int cycles;
  int step;
  unsigned_long __vla_expr0;
  int local_630;
  uint32_t local_62c;
  int watch_reg_local;
  uint32_t test_failed_address_local;
  char *log_filename_local;
  char *pcStack_618;
  int num_log_lines_local;
  char *rom_filename_local;
  uint local_608;
  undefined4 local_604;
  uint32_t value_31;
  uint32_t local_5f8;
  undefined4 local_5f4;
  uint32_t value_30;
  uint local_5e8;
  undefined4 local_5e4;
  uint32_t value_29;
  uint32_t local_5d8;
  undefined4 local_5d4;
  uint32_t value_28;
  uint local_5c8;
  undefined4 local_5c4;
  uint32_t value_27;
  uint32_t local_5b8;
  undefined4 local_5b4;
  uint32_t value_26;
  uint local_5a8;
  undefined4 local_5a4;
  uint32_t value_25;
  uint32_t local_598;
  undefined4 local_594;
  uint32_t value_24;
  uint local_588;
  undefined4 local_584;
  uint32_t value_23;
  uint32_t local_578;
  undefined4 local_574;
  uint32_t value_22;
  uint local_568;
  undefined4 local_564;
  uint32_t value_21;
  uint32_t local_558;
  undefined4 local_554;
  uint32_t value_20;
  uint local_548;
  undefined4 local_544;
  uint32_t value_19;
  uint32_t local_538;
  undefined4 local_534;
  uint32_t value_18;
  uint local_528;
  undefined4 local_524;
  uint32_t value_17;
  uint32_t local_518;
  undefined4 local_514;
  uint32_t value_16;
  uint local_508;
  undefined4 local_504;
  uint32_t value_15;
  uint32_t local_4f8;
  undefined4 local_4f4;
  uint32_t value_14;
  uint local_4e8;
  undefined4 local_4e4;
  uint32_t value_13;
  uint32_t local_4d8;
  undefined4 local_4d4;
  uint32_t value_12;
  uint local_4c8;
  undefined4 local_4c4;
  uint32_t value_11;
  uint32_t local_4b8;
  undefined4 local_4b4;
  uint32_t value_10;
  uint local_4a8;
  undefined4 local_4a4;
  uint32_t value_9;
  uint32_t local_498;
  undefined4 local_494;
  uint32_t value_8;
  uint local_488;
  undefined4 local_484;
  uint32_t value_7;
  uint32_t local_478;
  undefined4 local_474;
  uint32_t value_6;
  uint local_468;
  undefined4 local_464;
  uint32_t value_5;
  uint32_t local_458;
  undefined4 local_454;
  uint32_t value_4;
  uint local_448;
  undefined4 local_444;
  uint32_t value_3;
  uint32_t local_438;
  undefined4 local_434;
  uint32_t value_2;
  uint local_428;
  undefined4 local_424;
  uint32_t value_1;
  uint32_t local_418;
  undefined4 local_414;
  uint32_t value;
  arm7tdmi_t *local_268;
  uint32_t local_25c;
  arm7tdmi_t *local_258;
  uint local_24c;
  arm7tdmi_t *local_48;
  uint32_t local_3c;
  arm7tdmi_t *local_38;
  uint local_2c;
  
  gba_log_verbosity = 4;
  local_630 = watch_reg;
  local_62c = test_failed_address;
  _watch_reg_local = log_filename;
  log_filename_local._4_4_ = num_log_lines;
  pcStack_618 = rom_filename;
  init_gbasystem(in_stack_fffffffffffff620,in_stack_fffffffffffff618,false);
  skip_bios(in_stack_fffffffffffff700);
  uVar6 = (ulong)log_filename_local._4_4_;
  __vla_expr0 = (unsigned_long)&stack0xfffffffffffff618;
  lVar4 = uVar6 * -0x50;
  local_660 = &stack0xfffffffffffff618 + lVar4;
  _cycles = uVar6;
  *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x10276c;
  load_log((char *)local_970[uVar6 * -10],*(int *)((long)local_970 + lVar4 + -4),
           (cpu_log_t *)(&local_980)[uVar6 * -10]);
  if (1 < gba_log_verbosity) {
    sVar3 = mem->rom_size;
    *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x102794;
    printf("\x1b[0;36m[INFO]  ROM loaded: %lu bytes\n\x1b[0;m",sVar3);
  }
  if (1 < gba_log_verbosity) {
    *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1027ae;
    printf("\x1b[0;36m[INFO]  Beginning CPU loop\n\x1b[0;m");
  }
  adjusted_pc = 0;
  local_648 = 0;
  do {
    iVar5 = 4;
    if (((cpu->cpsr).raw >> 5 & 1) != 0) {
      iVar5 = 2;
    }
    failed_test = cpu->pc - iVar5;
    if ((int)adjusted_pc < (int)log_filename_local._4_4_) {
      if (2 < gba_log_verbosity) {
        uVar11 = (ulong)adjusted_pc;
        uVar9 = adjusted_pc + 1;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x102864;
        printf("[DEBUG] Checking registers against step %d (line %d in log)\n",uVar11,(ulong)uVar9);
      }
      iVar5 = 4;
      if (((cpu->cpsr).raw >> 5 & 1) != 0) {
        iVar5 = 2;
      }
      if (*(int *)(local_660 + (long)(int)adjusted_pc * 0x50) != cpu->pc - iVar5) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1028e3;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x5a);
        uVar9 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50);
        uVar1 = cpu->pc;
        iVar5 = 4;
        if (((cpu->cpsr).raw >> 5 & 1) != 0) {
          iVar5 = 2;
        }
        uVar6 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x102955;
        fprintf(_stderr,
                "ASSERTION FAILED: Address expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                ,(ulong)uVar9,(ulong)(uVar1 - iVar5),uVar6);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x10295f;
        exit(1);
      }
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 8) != (cpu->cpsr).raw) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x10299b;
        printf("Expected cpsr: ");
        pcVar12 = "-";
        if (*(int *)(local_660 + (long)(int)adjusted_pc * 0x50 + 8) < 0) {
          pcVar12 = "N";
        }
        pcVar10 = "-";
        if ((*(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 8) >> 0x1e & 1) == 1) {
          pcVar10 = "Z";
        }
        pcVar8 = "-";
        if ((*(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 8) >> 0x1d & 1) == 1) {
          pcVar8 = "C";
        }
        pcVar13 = "-";
        if ((*(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 8) >> 0x1c & 1) == 1) {
          pcVar13 = "V";
        }
        pcVar15 = "-";
        if ((*(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 8) >> 7 & 1) == 1) {
          pcVar15 = "I";
        }
        pcVar16 = "-";
        if ((*(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 8) >> 6 & 1) == 1) {
          pcVar16 = "F";
        }
        pcVar7 = "-";
        if ((*(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 8) >> 5 & 1) == 1) {
          pcVar7 = "T";
        }
        auStackY_a00[uVar6 * -10 + 1] = pcVar16;
        *(char **)(&stack0xfffffffffffff610 + lVar4) = pcVar7;
        auStackY_a00[uVar6 * -10] = 0x102b36;
        printf("[%s%s%s%s%s%s%s]",pcVar12,pcVar10,pcVar8,pcVar13,pcVar15);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x102b48;
        printf(" Actual cpsr: ");
        pcVar12 = "-";
        if ((int)(cpu->cpsr).raw < 0) {
          pcVar12 = "N";
        }
        pcVar10 = "-";
        if (((cpu->cpsr).raw >> 0x1e & 1) == 1) {
          pcVar10 = "Z";
        }
        pcVar8 = "-";
        if (((cpu->cpsr).raw >> 0x1d & 1) == 1) {
          pcVar8 = "C";
        }
        pcVar13 = "-";
        if (((cpu->cpsr).raw >> 0x1c & 1) == 1) {
          pcVar13 = "V";
        }
        pcVar15 = "-";
        if (((cpu->cpsr).raw >> 7 & 1) == 1) {
          pcVar15 = "I";
        }
        pcVar16 = "-";
        if (((cpu->cpsr).raw >> 6 & 1) == 1) {
          pcVar16 = "F";
        }
        pcVar7 = "-";
        if (((cpu->cpsr).raw >> 5 & 1) == 1) {
          pcVar7 = "T";
        }
        auStackY_a00[uVar6 * -10 + 1] = pcVar16;
        *(char **)(&stack0xfffffffffffff610 + lVar4) = pcVar7;
        auStackY_a00[uVar6 * -10] = 0x102cb2;
        printf("[%s%s%s%s%s%s%s]",pcVar12,pcVar10,pcVar8,pcVar13,pcVar15);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x102cc4;
        printf("\n");
      }
      local_664 = *(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0xc);
      _value = cpu;
      local_414 = 0;
      local_418 = cpu->r[0];
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0xc) != local_418) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x102fdf;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,100);
        local_688 = _stderr;
        local_67c = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0xc);
        _value_1 = cpu;
        local_424 = 0;
        local_428 = cpu->r[0];
        uVar11 = (ulong)local_67c;
        uVar6 = (ulong)local_428;
        uVar14 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1032fd;
        fprintf(_stderr,
                "ASSERTION FAILED: r0 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m",
                uVar11,uVar6,uVar14);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x103307;
        exit(1);
      }
      local_69c = *(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x10);
      _value_2 = cpu;
      local_434 = 1;
      local_438 = cpu->r[1];
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x10) != local_438) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x103622;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x65);
        local_6c0 = _stderr;
        local_6b4 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x10);
        _value_3 = cpu;
        local_444 = 1;
        local_448 = cpu->r[1];
        uVar11 = (ulong)local_6b4;
        uVar6 = (ulong)local_448;
        uVar14 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x103940;
        fprintf(_stderr,
                "ASSERTION FAILED: r1 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m",
                uVar11,uVar6,uVar14);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x10394a;
        exit(1);
      }
      local_6d4 = *(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x14);
      _value_4 = cpu;
      local_454 = 2;
      local_458 = cpu->r[2];
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x14) != local_458) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x103c65;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x66);
        local_6f8 = _stderr;
        local_6ec = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x14);
        _value_5 = cpu;
        local_464 = 2;
        local_468 = cpu->r[2];
        uVar11 = (ulong)local_6ec;
        uVar6 = (ulong)local_468;
        uVar14 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x103f83;
        fprintf(_stderr,
                "ASSERTION FAILED: r2 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m",
                uVar11,uVar6,uVar14);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x103f8d;
        exit(1);
      }
      local_70c = *(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x18);
      _value_6 = cpu;
      local_474 = 3;
      local_478 = cpu->r[3];
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x18) != local_478) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1042a8;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x67);
        local_730 = _stderr;
        local_724 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x18);
        _value_7 = cpu;
        local_484 = 3;
        local_488 = cpu->r[3];
        uVar11 = (ulong)local_724;
        uVar6 = (ulong)local_488;
        uVar14 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1045c6;
        fprintf(_stderr,
                "ASSERTION FAILED: r3 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m",
                uVar11,uVar6,uVar14);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1045d0;
        exit(1);
      }
      local_744 = *(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x1c);
      _value_8 = cpu;
      local_494 = 4;
      local_498 = cpu->r[4];
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x1c) != local_498) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1048eb;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x68);
        local_768 = _stderr;
        local_75c = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x1c);
        _value_9 = cpu;
        local_4a4 = 4;
        local_4a8 = cpu->r[4];
        uVar11 = (ulong)local_75c;
        uVar6 = (ulong)local_4a8;
        uVar14 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x104c09;
        fprintf(_stderr,
                "ASSERTION FAILED: r4 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m",
                uVar11,uVar6,uVar14);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x104c13;
        exit(1);
      }
      local_77c = *(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x20);
      _value_10 = cpu;
      local_4b4 = 5;
      local_4b8 = cpu->r[5];
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x20) != local_4b8) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x104f2e;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x69);
        local_7a0 = _stderr;
        local_794 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x20);
        _value_11 = cpu;
        local_4c4 = 5;
        local_4c8 = cpu->r[5];
        uVar11 = (ulong)local_794;
        uVar6 = (ulong)local_4c8;
        uVar14 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x10524c;
        fprintf(_stderr,
                "ASSERTION FAILED: r5 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m",
                uVar11,uVar6,uVar14);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x105256;
        exit(1);
      }
      local_7b4 = *(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x24);
      _value_12 = cpu;
      local_4d4 = 6;
      local_4d8 = cpu->r[6];
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x24) != local_4d8) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x105571;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x6a);
        local_7d8 = _stderr;
        local_7cc = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x24);
        _value_13 = cpu;
        local_4e4 = 6;
        local_4e8 = cpu->r[6];
        uVar11 = (ulong)local_7cc;
        uVar6 = (ulong)local_4e8;
        uVar14 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x10588f;
        fprintf(_stderr,
                "ASSERTION FAILED: r6 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m",
                uVar11,uVar6,uVar14);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x105899;
        exit(1);
      }
      local_7ec = *(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x28);
      _value_14 = cpu;
      local_4f4 = 7;
      local_4f8 = cpu->r[7];
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x28) != local_4f8) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x105bb4;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x6b);
        local_810 = _stderr;
        local_804 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x28);
        _value_15 = cpu;
        local_504 = 7;
        local_508 = cpu->r[7];
        uVar11 = (ulong)local_804;
        uVar6 = (ulong)local_508;
        uVar14 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x105ed2;
        fprintf(_stderr,
                "ASSERTION FAILED: r7 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m",
                uVar11,uVar6,uVar14);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x105edc;
        exit(1);
      }
      local_824 = *(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x2c);
      _value_16 = cpu;
      local_514 = 8;
      if (((cpu->cpsr).raw & 0x1f) == 0x11) {
        local_518 = cpu->highreg_fiq[0];
      }
      else {
        local_518 = cpu->r[8];
      }
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x2c) != local_518) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1061f7;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x6c);
        local_848 = _stderr;
        local_83c = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x2c);
        _value_17 = cpu;
        local_524 = 8;
        if (((cpu->cpsr).raw & 0x1f) == 0x11) {
          local_528 = cpu->highreg_fiq[0];
        }
        else {
          local_528 = cpu->r[8];
        }
        uVar11 = (ulong)local_83c;
        uVar6 = (ulong)local_528;
        uVar14 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x106515;
        fprintf(_stderr,
                "ASSERTION FAILED: r8 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m",
                uVar11,uVar6,uVar14);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x10651f;
        exit(1);
      }
      _value_18 = cpu;
      local_534 = 9;
      if (((cpu->cpsr).raw & 0x1f) == 0x11) {
        local_538 = cpu->highreg_fiq[1];
      }
      else {
        local_538 = cpu->r[9];
      }
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x30) != local_538) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x10683a;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x6d);
        uVar9 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x30);
        _value_19 = cpu;
        local_544 = 9;
        if (((cpu->cpsr).raw & 0x1f) == 0x11) {
          local_548 = cpu->highreg_fiq[1];
        }
        else {
          local_548 = cpu->r[9];
        }
        uVar6 = (ulong)local_548;
        uVar11 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x106b58;
        fprintf(_stderr,
                "ASSERTION FAILED: r9 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m",
                (ulong)uVar9,uVar6,uVar11);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x106b62;
        exit(1);
      }
      _value_20 = cpu;
      local_554 = 10;
      if (((cpu->cpsr).raw & 0x1f) == 0x11) {
        local_558 = cpu->highreg_fiq[2];
      }
      else {
        local_558 = cpu->r[10];
      }
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x34) != local_558) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x106e7d;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x6e);
        uVar9 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x34);
        _value_21 = cpu;
        local_564 = 10;
        if (((cpu->cpsr).raw & 0x1f) == 0x11) {
          local_568 = cpu->highreg_fiq[2];
        }
        else {
          local_568 = cpu->r[10];
        }
        uVar6 = (ulong)local_568;
        uVar11 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x10719b;
        fprintf(_stderr,
                "ASSERTION FAILED: r10 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                ,(ulong)uVar9,uVar6,uVar11);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1071a5;
        exit(1);
      }
      _value_22 = cpu;
      local_574 = 0xb;
      if (((cpu->cpsr).raw & 0x1f) == 0x11) {
        local_578 = cpu->highreg_fiq[3];
      }
      else {
        local_578 = cpu->r[0xb];
      }
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x38) != local_578) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1074c0;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x6f);
        uVar9 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x38);
        _value_23 = cpu;
        local_584 = 0xb;
        if (((cpu->cpsr).raw & 0x1f) == 0x11) {
          local_588 = cpu->highreg_fiq[3];
        }
        else {
          local_588 = cpu->r[0xb];
        }
        uVar6 = (ulong)local_588;
        uVar11 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1077de;
        fprintf(_stderr,
                "ASSERTION FAILED: r11 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                ,(ulong)uVar9,uVar6,uVar11);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1077e8;
        exit(1);
      }
      local_904 = *(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x3c);
      _value_24 = cpu;
      local_594 = 0xc;
      if (((cpu->cpsr).raw & 0x1f) == 0x11) {
        local_598 = cpu->highreg_fiq[4];
      }
      else {
        local_598 = cpu->r[0xc];
      }
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x3c) != local_598) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x107ad2;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x70);
        local_928 = _stderr;
        local_91c = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x3c);
        _value_25 = cpu;
        local_5a4 = 0xc;
        if (((cpu->cpsr).raw & 0x1f) == 0x11) {
          local_5a8 = cpu->highreg_fiq[4];
        }
        else {
          local_5a8 = cpu->r[0xc];
        }
        uVar11 = (ulong)local_91c;
        uVar6 = (ulong)local_5a8;
        uVar14 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x107dbf;
        fprintf(_stderr,
                "ASSERTION FAILED: r12 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                ,uVar11,uVar6,uVar14);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x107dc9;
        exit(1);
      }
      local_93c = *(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x40);
      _value_26 = cpu;
      local_5b4 = 0xd;
      local_268 = cpu;
      local_948 = (ulong)(((cpu->cpsr).raw & 0x1f) - 0x11);
      switch(local_948) {
      case 0:
        local_25c = cpu->sp_fiq;
        break;
      case 1:
        local_25c = cpu->sp_irq;
        break;
      case 2:
        local_25c = cpu->sp_svc;
        break;
      default:
        local_25c = cpu->sp;
        break;
      case 6:
        local_25c = cpu->sp_abt;
        break;
      case 10:
        local_25c = cpu->sp_und;
      }
      local_5b8 = local_25c;
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x40) != local_25c) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1080b3;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x71);
        local_960 = _stderr;
        local_954 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x40);
        _value_27 = cpu;
        local_5c4 = 0xd;
        local_970[1] = (ulong)(((cpu->cpsr).raw & 0x1f) - 0x11);
        switch(local_970[1]) {
        case 0:
          local_24c = cpu->sp_fiq;
          break;
        case 1:
          local_24c = cpu->sp_irq;
          break;
        case 2:
          local_24c = cpu->sp_svc;
          break;
        default:
          local_24c = cpu->sp;
          break;
        case 6:
          local_24c = cpu->sp_abt;
          break;
        case 10:
          local_24c = cpu->sp_und;
        }
        local_258 = cpu;
        local_5c8 = local_24c;
        uVar11 = (ulong)local_954;
        uVar6 = (ulong)local_24c;
        uVar14 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1083a0;
        fprintf(_stderr,
                "ASSERTION FAILED: r13 (SP) expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                ,uVar11,uVar6,uVar14);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1083aa;
        exit(1);
      }
      local_974 = *(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x44);
      _value_28 = cpu;
      local_5d4 = 0xe;
      local_48 = cpu;
      switch((cpu->cpsr).raw & 0x1f) {
      case 0x11:
        local_3c = cpu->lr_fiq;
        break;
      case 0x12:
        local_3c = cpu->lr_irq;
        break;
      case 0x13:
        local_3c = cpu->lr_svc;
        break;
      default:
        local_3c = cpu->lr;
        break;
      case 0x17:
        local_3c = cpu->lr_abt;
        break;
      case 0x1b:
        local_3c = cpu->lr_und;
      }
      local_5d8 = local_3c;
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x44) != local_3c) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x108694;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x72);
        uVar9 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x44);
        _value_29 = cpu;
        local_5e4 = 0xe;
        switch((cpu->cpsr).raw & 0x1f) {
        case 0x11:
          local_2c = cpu->lr_fiq;
          break;
        case 0x12:
          local_2c = cpu->lr_irq;
          break;
        case 0x13:
          local_2c = cpu->lr_svc;
          break;
        default:
          local_2c = cpu->lr;
          break;
        case 0x17:
          local_2c = cpu->lr_abt;
          break;
        case 0x1b:
          local_2c = cpu->lr_und;
        }
        local_38 = cpu;
        local_5e8 = local_2c;
        uVar6 = (ulong)local_2c;
        uVar11 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x108981;
        fprintf(_stderr,
                "ASSERTION FAILED: r14 (LR) expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                ,(ulong)uVar9,uVar6,uVar11);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x10898b;
        exit(1);
      }
      _value_30 = cpu;
      local_5f4 = 0xf;
      local_5f8 = cpu->pc;
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x48) != local_5f8) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x108c75;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x73);
        uVar9 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x48);
        _value_31 = cpu;
        local_604 = 0xf;
        local_608 = cpu->pc;
        uVar6 = (ulong)local_608;
        uVar11 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x108f62;
        fprintf(_stderr,
                "ASSERTION FAILED: r15 (PC) expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                ,(ulong)uVar9,uVar6,uVar11);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x108f6c;
        exit(1);
      }
      if (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 8) != (cpu->cpsr).raw) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x108fba;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,0x74);
        uVar9 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 8);
        uVar2 = (cpu->cpsr).raw;
        uVar6 = (ulong)failed_test;
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x109001;
        fprintf(_stderr,
                "ASSERTION FAILED: CPSR expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                ,(ulong)uVar9,(ulong)uVar2,uVar6);
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x10900b;
        exit(1);
      }
      if ((local_648 != *(int *)(local_660 + (long)(int)adjusted_pc * 0x50 + 0x4c)) &&
         (gba_log_verbosity != 0)) {
        *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x109045;
        printf("\x1b[0;33m[WARN]  Cycles incorrect!\n\x1b[0;m");
      }
    }
    else if (local_630 < 0) {
      return 0;
    }
    *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x109058;
    local_648 = arm7tdmi_step((arm7tdmi_t *)(&local_848)[uVar6 * -10]);
    if (((int)adjusted_pc < (int)log_filename_local._4_4_) &&
       (*(uint32_t *)(local_660 + (long)(int)adjusted_pc * 0x50 + 4) != cpu->instr)) {
      *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1090be;
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h",
              0x7e);
      uVar9 = *(uint *)(local_660 + (long)(int)adjusted_pc * 0x50 + 4);
      uVar2 = cpu->instr;
      uVar6 = (ulong)failed_test;
      *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x109105;
      fprintf(_stderr,
              "ASSERTION FAILED: instruction expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
              ,(ulong)uVar9,(ulong)uVar2,uVar6);
      *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x10910f;
      exit(1);
    }
    adjusted_pc = adjusted_pc + 1;
    if ((failed_test == local_62c) && (0 < local_630)) {
      local_654 = cpu->r[local_630];
      if (local_654 == 0) {
        if (1 < gba_log_verbosity) {
          *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1091c9;
          printf("\x1b[0;36m[INFO]  Passed all tests!\n\x1b[0;m");
        }
        return 0;
      }
      *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x109187;
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h",
              0x85);
      uVar6 = (ulong)local_654;
      *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1091a5;
      fprintf(_stderr,"FAILED TEST: %d\n\x1b[0;m",uVar6);
      *(undefined8 *)(&stack0xfffffffffffff610 + lVar4) = 0x1091af;
      exit(1);
    }
  } while( true );
}

Assistant:

int test_loop(const char* rom_filename, int num_log_lines, const char* log_filename, word test_failed_address, int watch_reg) {
    log_set_verbosity(4);
    init_gbasystem(rom_filename, NULL, false);

    skip_bios(cpu);

    cpu_log_t lines[num_log_lines];

    load_log(log_filename, num_log_lines, lines);

    loginfo("ROM loaded: %lu bytes", mem->rom_size)
    loginfo("Beginning CPU loop")
    int step = 0;
    int cycles = 0;

    while(true) {
        word adjusted_pc = cpu->pc - (cpu->cpsr.thumb ? 2 : 4);
        if (step >= num_log_lines) {
            if (watch_reg < 0) {
                return 0; // We win!
            }
        } else {
            // Register values in the log are BEFORE EXECUTING the instruction on that line
            logdebug("Checking registers against step %d (line %d in log)", step, step + 1)
            ASSERT_EQUAL(adjusted_pc, "Address", lines[step].address, cpu->pc - (cpu->cpsr.thumb ? 2 : 4))

            if (lines[step].cpsr.raw != cpu->cpsr.raw) {
                printf("Expected cpsr: ");
                printcpsr(lines[step].cpsr);
                printf(" Actual cpsr: ");
                printcpsr(cpu->cpsr);
                printf("\n");
            }

            ASSERT_EQUAL(adjusted_pc, "r0", lines[step].r[0], get_register(cpu, 0))
            ASSERT_EQUAL(adjusted_pc, "r1", lines[step].r[1], get_register(cpu, 1))
            ASSERT_EQUAL(adjusted_pc, "r2", lines[step].r[2], get_register(cpu, 2))
            ASSERT_EQUAL(adjusted_pc, "r3", lines[step].r[3], get_register(cpu, 3))
            ASSERT_EQUAL(adjusted_pc, "r4", lines[step].r[4], get_register(cpu, 4))
            ASSERT_EQUAL(adjusted_pc, "r5", lines[step].r[5], get_register(cpu, 5))
            ASSERT_EQUAL(adjusted_pc, "r6", lines[step].r[6], get_register(cpu, 6))
            ASSERT_EQUAL(adjusted_pc, "r7", lines[step].r[7], get_register(cpu, 7))
            ASSERT_EQUAL(adjusted_pc, "r8", lines[step].r[8], get_register(cpu, 8))
            ASSERT_EQUAL(adjusted_pc, "r9", lines[step].r[9], get_register(cpu, 9))
            ASSERT_EQUAL(adjusted_pc, "r10", lines[step].r[10], get_register(cpu, 10))
            ASSERT_EQUAL(adjusted_pc, "r11", lines[step].r[11], get_register(cpu, 11))
            ASSERT_EQUAL(adjusted_pc, "r12", lines[step].r[12], get_register(cpu, 12))
            ASSERT_EQUAL(adjusted_pc, "r13 (SP)", lines[step].r[13], get_register(cpu, 13))
            ASSERT_EQUAL(adjusted_pc, "r14 (LR)", lines[step].r[14], get_register(cpu, 14))
            ASSERT_EQUAL(adjusted_pc, "r15 (PC)", lines[step].r[15], get_register(cpu, 15))
            ASSERT_EQUAL(adjusted_pc, "CPSR", lines[step].cpsr.raw, cpu->cpsr.raw)

            //ASSERT_EQUAL(adjusted_pc, "cycles", lines[step].cycles, cycles)
            if (cycles != lines[step].cycles) {
                logwarn("Cycles incorrect!")
            }
        }

        cycles = arm7tdmi_step(cpu);
        if (step < num_log_lines) {
            ASSERT_EQUAL(adjusted_pc, "instruction", lines[step].instruction, cpu->instr)
        }
        step++;

        if (adjusted_pc == test_failed_address && watch_reg > 0) {
            word failed_test = cpu->r[watch_reg];
            if (failed_test > 0) {
                logfatal("FAILED TEST: %d", failed_test)
            } else {
                loginfo("Passed all tests!")
                return 0;
            }
        }
    }
}